

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

double __thiscall
gl4cts::EnhancedLayouts::Utils::Program::BuildException::log(BuildException *this,double __x)

{
  ostringstream *this_00;
  Context *in_RSI;
  double extraout_XMM0_Qa;
  undefined1 local_198 [384];
  
  local_198._0_8_ = in_RSI->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Link failure: ");
  std::operator<<((ostream *)this_00,(string *)&this->m_error_message);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  Utils::Shader::LogSource(in_RSI,&this->m_vertex_shader,VERTEX);
  Utils::Shader::LogSource(in_RSI,&this->m_tess_ctrl_shader,TESS_CTRL);
  Utils::Shader::LogSource(in_RSI,&this->m_tess_eval_shader,TESS_EVAL);
  Utils::Shader::LogSource(in_RSI,&this->m_geometry_shader,GEOMETRY);
  Utils::Shader::LogSource(in_RSI,&this->m_fragment_shader,FRAGMENT);
  Utils::Shader::LogSource(in_RSI,&this->m_compute_shader,COMPUTE);
  return extraout_XMM0_Qa;
}

Assistant:

void Program::BuildException::log(deqp::Context& context) const
{
	context.getTestContext().getLog() << tcu::TestLog::Message << "Link failure: " << m_error_message
									  << tcu::TestLog::EndMessage;

	Shader::LogSource(context, m_vertex_shader, Shader::VERTEX);
	Shader::LogSource(context, m_tess_ctrl_shader, Shader::TESS_CTRL);
	Shader::LogSource(context, m_tess_eval_shader, Shader::TESS_EVAL);
	Shader::LogSource(context, m_geometry_shader, Shader::GEOMETRY);
	Shader::LogSource(context, m_fragment_shader, Shader::FRAGMENT);
	Shader::LogSource(context, m_compute_shader, Shader::COMPUTE);
}